

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuffer.c
# Opt level: O0

char strbuffer_pop(strbuffer_t *strbuff)

{
  size_t sVar1;
  char c;
  strbuffer_t *strbuff_local;
  
  if (strbuff->length == 0) {
    strbuff_local._7_1_ = '\0';
  }
  else {
    sVar1 = strbuff->length;
    strbuff->length = sVar1 - 1;
    strbuff_local._7_1_ = strbuff->value[sVar1 - 1];
    strbuff->value[strbuff->length] = '\0';
  }
  return strbuff_local._7_1_;
}

Assistant:

char strbuffer_pop(strbuffer_t *strbuff)
{
    if(strbuff->length > 0) {
        char c = strbuff->value[--strbuff->length];
        strbuff->value[strbuff->length] = '\0';
        return c;
    }
    else
        return '\0';
}